

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::parseContentStream_internal
          (QPDFObjectHandle *this,string *description,ParserCallbacks *callbacks)

{
  element_type *peVar1;
  size_t sVar2;
  QPDF *context;
  shared_ptr<Buffer> stream_data;
  string all_description;
  Pl_Buffer buf;
  undefined1 local_a0 [24];
  undefined1 local_88 [16];
  Pipeline *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Pl_Buffer local_60;
  
  Pl_Buffer::Pl_Buffer(&local_60,"concatenated stream data buffer",(Pipeline *)0x0);
  local_78 = (Pipeline *)0x0;
  local_70._M_local_buf[0] = '\0';
  local_88._8_8_ = &local_70;
  pipeContentStreams(this,&local_60.super_Pipeline,description,(string *)(local_88 + 8));
  Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_a0);
  sVar2 = Buffer::getSize((Buffer *)local_a0._0_8_);
  (*callbacks->_vptr_ParserCallbacks[5])(callbacks,sVar2);
  local_a0._16_8_ = local_a0._0_8_;
  local_88._0_8_ = local_a0._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a0._8_8_ + 8) = *(_Atomic_word *)(local_a0._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a0._8_8_ + 8) = *(_Atomic_word *)(local_a0._8_8_ + 8) + 1;
    }
  }
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    context = (QPDF *)0x0;
  }
  else {
    context = peVar1->qpdf;
  }
  parseContentStream_data
            ((shared_ptr<Buffer> *)(local_a0 + 0x10),(string *)(local_88 + 8),callbacks,context);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._0_8_);
  }
  (*callbacks->_vptr_ParserCallbacks[4])(callbacks);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._8_8_ != &local_70) {
    operator_delete((void *)local_88._8_8_,
                    CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1);
  }
  Pl_Buffer::~Pl_Buffer(&local_60);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_internal(
    std::string const& description, ParserCallbacks* callbacks)
{
    Pl_Buffer buf("concatenated stream data buffer");
    std::string all_description;
    pipeContentStreams(&buf, description, all_description);
    auto stream_data = buf.getBufferSharedPointer();
    callbacks->contentSize(stream_data->getSize());
    try {
        parseContentStream_data(stream_data, all_description, callbacks, getOwningQPDF());
    } catch (TerminateParsing&) {
        return;
    }
    callbacks->handleEOF();
}